

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

char * __thiscall CServer::GetMapName(CServer *this)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *str;
  
  str = this->m_pConfig->m_SvMap;
  iVar2 = str_length(str);
  if (1 < iVar2) {
    lVar3 = 0x10ad;
    do {
      cVar1 = *(char *)((long)this->m_pConfig + lVar3 + -1);
      if ((cVar1 == '\\') || (cVar1 == '/')) {
        str = (char *)((long)&this->m_pConfig->m_ClPredict + lVar3);
      }
      iVar2 = str_length(this->m_pConfig->m_SvMap);
      lVar4 = lVar3 + -0x10ac;
      lVar3 = lVar3 + 1;
    } while (lVar4 < iVar2 + -1);
  }
  return str;
}

Assistant:

const char *CServer::GetMapName()
{
	// get the name of the map without his path
	char *pMapShortName = &Config()->m_SvMap[0];
	for(int i = 0; i < str_length(Config()->m_SvMap)-1; i++)
	{
		if(Config()->m_SvMap[i] == '/' || Config()->m_SvMap[i] == '\\')
			pMapShortName = &Config()->m_SvMap[i+1];
	}
	return pMapShortName;
}